

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

Vec_Ptr_t * Gia_ManOrderPios(Aig_Man_t *p,Gia_Man_t *pOrder)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar3;
  bool bVar4;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vPios;
  Gia_Man_t *pOrder_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Gia_ManCiNum(pOrder);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(p) == Gia_ManCiNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf3,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Aig_ManCoNum(p);
  iVar2 = Gia_ManCoNum(pOrder);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCoNum(p) == Gia_ManCoNum(pOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaScript.c"
                  ,0xf4,"Vec_Ptr_t *Gia_ManOrderPios(Aig_Man_t *, Gia_Man_t *)");
  }
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Aig_ManCoNum(p);
  p_00 = Vec_PtrAlloc(iVar1 + iVar2);
  local_2c = 0;
  while( true ) {
    bVar4 = false;
    if (local_2c < pOrder->nObjs) {
      pGStack_28 = Gia_ManObj(pOrder,local_2c);
      bVar4 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsCi(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_28);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjCioId(pGStack_28);
        pAVar3 = Aig_ManCo(p,iVar1);
        Vec_PtrPush(p_00,pAVar3);
      }
    }
    else {
      iVar1 = Gia_ObjCioId(pGStack_28);
      pAVar3 = Aig_ManCi(p,iVar1);
      Vec_PtrPush(p_00,pAVar3);
    }
    local_2c = local_2c + 1;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Gia_ManOrderPios( Aig_Man_t * p, Gia_Man_t * pOrder )
{
    Vec_Ptr_t * vPios;
    Gia_Obj_t * pObj;
    int i;
    assert( Aig_ManCiNum(p) == Gia_ManCiNum(pOrder) );
    assert( Aig_ManCoNum(p) == Gia_ManCoNum(pOrder) );
    vPios = Vec_PtrAlloc( Aig_ManCiNum(p) + Aig_ManCoNum(p) );
    Gia_ManForEachObj( pOrder, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            Vec_PtrPush( vPios, Aig_ManCi(p, Gia_ObjCioId(pObj)) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_PtrPush( vPios, Aig_ManCo(p, Gia_ObjCioId(pObj)) );
    }
    return vPios;
}